

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_setParams(ZSTD_CCtx *cctx,ZSTD_parameters params)

{
  ZSTD_compressionParameters cParams;
  ZSTD_frameParameters fparams;
  uint uVar1;
  size_t sVar2;
  ZSTD_compressionParameters in_stack_00000010;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *cctx_00;
  undefined1 in_stack_ffffffffffffffb4 [12];
  undefined1 *puVar3;
  ZSTD_strategy in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  int in_stack_ffffffffffffffcc;
  undefined4 uVar5;
  ZSTD_CCtx *in_stack_fffffffffffffff8;
  
  puVar3 = &stack0x00000008;
  cctx_00 = in_stack_00000010._8_8_;
  cParams._4_12_ = in_stack_ffffffffffffffb4;
  cParams.windowLog = in_stack_00000010.minMatch;
  cParams.minMatch = (int)puVar3;
  cParams.targetLength = (int)((ulong)puVar3 >> 0x20);
  cParams.strategy = in_stack_ffffffffffffffc8;
  sVar2 = ZSTD_checkCParams(cParams);
  uVar1 = ERR_isError(sVar2);
  if (uVar1 == 0) {
    fparams.checksumFlag = in_stack_ffffffffffffffc8;
    fparams.contentSizeFlag = (int)((ulong)puVar3 >> 0x20);
    fparams.noDictIDFlag = in_stack_ffffffffffffffcc;
    sVar2 = ZSTD_CCtx_setFParams(cctx_00,fparams);
    uVar1 = ERR_isError(sVar2);
    if (uVar1 == 0) {
      sVar2 = ZSTD_CCtx_setCParams(in_stack_fffffffffffffff8,in_stack_00000010);
      uVar4 = (undefined4)sVar2;
      uVar5 = (undefined4)(sVar2 >> 0x20);
      uVar1 = ERR_isError(sVar2);
      if (uVar1 == 0) {
        sVar2 = 0;
      }
      else {
        sVar2 = CONCAT44(uVar5,uVar4);
      }
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_setParams(ZSTD_CCtx* cctx, ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParams");
    /* First check cParams, because we want to update all or none. */
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams), "");
    /* Next set fParams, because this could fail if the cctx isn't in init stage. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setFParams(cctx, params.fParams), "");
    /* Finally set cParams, which should succeed. */
    FORWARD_IF_ERROR(ZSTD_CCtx_setCParams(cctx, params.cParams), "");
    return 0;
}